

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O1

nng_err nuts_marry_ex(nng_socket s1,nng_socket s2,char *url,nng_pipe *p1,nng_pipe *p2)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  nng_err nVar6;
  int iVar7;
  nng_time nVar8;
  char *pcVar9;
  char *addr_00;
  char local_c8 [8];
  char addr [64];
  nng_mtx *local_78;
  marriage_notice note;
  int local_44;
  int local_40;
  int fd [2];
  int port;
  nng_listener l;
  
  addr._56_8_ = p1;
  note._32_8_ = url;
  if (url == (char *)0x0) {
    uVar2 = nng_random();
    uVar3 = nng_random();
    uVar4 = nng_random();
    uVar5 = nng_random();
    note._32_8_ = local_c8;
    snprintf((char *)note._32_8_,0x40,"inproc://marry%04x%04x%04x%04x",(ulong)uVar2,(ulong)uVar3,
             (ulong)uVar4,uVar5);
  }
  note.s1 = 0;
  note.s2 = 0;
  note.cv._0_4_ = nng_socket_id(s1);
  note.cv._4_4_ = nng_socket_id(s2);
  nVar8 = nng_clock();
  nVar6 = nng_mtx_alloc(&local_78);
  if ((((nVar6 == NNG_OK) && (nVar6 = nng_cv_alloc((nng_cv **)&note,local_78), nVar6 == NNG_OK)) &&
      (nVar6 = nng_pipe_notify(s1,NNG_PIPE_EV_ADD_POST,married,&local_78), nVar6 == NNG_OK)) &&
     (nVar6 = nng_pipe_notify(s2,NNG_PIPE_EV_ADD_POST,married,&local_78),
     addr_00 = (char *)note._32_8_, nVar6 == NNG_OK)) {
    iVar7 = strcmp((char *)note._32_8_,"socket://");
    if (iVar7 == 0) {
      nVar6 = nng_socket_pair(&local_44);
      if (nVar6 == NNG_ENOTSUP) {
        addr_00 = "tcp://127.0.0.1:0";
      }
      else {
        if (nVar6 != NNG_OK) {
          return nVar6;
        }
        nVar6 = nng_listen(s1,addr_00,(nng_listener *)(fd + 1),0);
        if (((nVar6 == NNG_OK) &&
            (nVar6 = nng_listen(s2,addr_00,(nng_listener *)fd,0), nVar6 == NNG_OK)) &&
           ((nVar6 = nng_listener_set_int((nng_listener)fd[1],"socket:fd",local_44), nVar6 == NNG_OK
            && (nVar6 = nng_listener_set_int((nng_listener)fd[0],"socket:fd",local_40),
               nVar6 == NNG_OK)))) {
          bVar1 = true;
          nVar6 = NNG_OK;
        }
        else {
          close(local_44);
          close(local_40);
          bVar1 = false;
        }
        if (!bVar1) {
          return nVar6;
        }
      }
    }
    iVar7 = strcmp(addr_00,"socket://");
    if ((iVar7 != 0) && (nVar6 = nng_listen(s1,addr_00,(nng_listener *)(fd + 1),0), nVar6 != NNG_OK)
       ) {
      return nVar6;
    }
    pcVar9 = strstr(addr_00,":0");
    if ((pcVar9 != (char *)0x0) &&
       (iVar7 = nng_listener_get_int((nng_listener)fd[1],"tcp-bound-port",fd),
       0 < fd[0] && iVar7 == 0)) {
      replace_port_zero(addr_00,local_c8,fd[0]);
      addr_00 = local_c8;
    }
    nVar6 = nng_socket_set_ms(s2,"reconnect-time-min",10);
    if (((nVar6 == NNG_OK) &&
        (nVar6 = nng_socket_set_ms(s2,"reconnect-time-max",10), nVar6 == NNG_OK)) &&
       ((iVar7 = strcmp(addr_00,"socket://"), iVar7 == 0 ||
        (nVar6 = nng_dial(s2,addr_00,(nng_dialer *)0x0,0), nVar6 == NNG_OK)))) {
      nng_mtx_lock(local_78);
      do {
        if ((note.s1 != 0) && (note.s2 != 0)) {
          nVar6 = NNG_OK;
          break;
        }
        nVar6 = nng_cv_until((nng_cv *)note.mx,nVar8 + 1000);
      } while (nVar6 == NNG_OK);
      nng_mtx_unlock(local_78);
      if (addr._56_8_ != 0) {
        *(int *)addr._56_8_ = note.cnt1;
      }
      if (p2 != (nng_pipe *)0x0) {
        p2->id = note.cnt2;
      }
    }
  }
  nng_pipe_notify(s1,NNG_PIPE_EV_ADD_POST,(nng_pipe_cb)0x0,(void *)0x0);
  nng_pipe_notify(s2,NNG_PIPE_EV_ADD_POST,(nng_pipe_cb)0x0,(void *)0x0);
  if (note.mx != (nng_mtx *)0x0) {
    nng_cv_free((nng_cv *)note.mx);
  }
  if (local_78 != (nng_mtx *)0x0) {
    nng_mtx_free(local_78);
  }
  return nVar6;
}

Assistant:

nng_err
nuts_marry_ex(
    nng_socket s1, nng_socket s2, const char *url, nng_pipe *p1, nng_pipe *p2)
{
	struct marriage_notice note;
	nng_time               timeout;
	nng_err                rv;
	char                   addr[64];
	nng_listener           l;
	int                    port;
	int                    fd[2];

	if (url == NULL) {
		(void) snprintf(addr, sizeof(addr),
		    "inproc://marry%04x%04x%04x%04x", nng_random(),
		    nng_random(), nng_random(), nng_random());
		url = addr;
	}

	note.cnt1 = 0;
	note.cnt2 = 0;
	note.s1   = nng_socket_id(s1);
	note.s2   = nng_socket_id(s2);
	timeout   = nng_clock() + 1000; // 1 second

	if (((rv = nng_mtx_alloc(&note.mx)) != 0) ||
	    ((rv = nng_cv_alloc(&note.cv, note.mx)) != 0) ||
	    ((rv = nng_pipe_notify(
	          s1, NNG_PIPE_EV_ADD_POST, married, &note)) != 0) ||
	    ((rv = nng_pipe_notify(
	          s2, NNG_PIPE_EV_ADD_POST, married, &note)) != 0)) {
		goto done;
	}

	// If socket:// is requested we will try to use that, otherwise we
	// fake it with a TCP loopback socket.
	if (strcmp(url, "socket://") == 0) {
		rv = nng_socket_pair(fd);
		if (rv == 0) {
			nng_listener l2;
			if (((rv = nng_listen(s1, url, &l, 0)) != 0) ||
			    ((rv = nng_listen(s2, url, &l2, 0)) != 0) ||
			    ((rv = nng_listener_set_int(
			          l, NNG_OPT_SOCKET_FD, fd[0])) != 0) ||
			    ((rv = nng_listener_set_int(
			          l2, NNG_OPT_SOCKET_FD, fd[1])) != 0)) {
#ifdef _WIN32
				_close(fd[0]);
				_close(fd[1]);
#else
				close(fd[0]);
				close(fd[1]);
#endif
				return (rv);
			}
		} else if (rv == NNG_ENOTSUP) {
			url = "tcp://127.0.0.1:0";
			rv  = NNG_OK;
		} else {
			return (rv);
		}
	}

	if (strcmp(url, "socket://") != 0) {
		if ((rv = nng_listen(s1, url, &l, 0)) != 0) {
			return (rv);
		}
	}
	if ((strstr(url, ":0") != NULL) &&
	    // If a TCP port of zero was selected, let's ask for the actual
	    // port bound.
	    (nng_listener_get_int(l, NNG_OPT_TCP_BOUND_PORT, &port) == 0) &&
	    (port > 0)) {
		replace_port_zero(url, addr, port);
		url = addr;
	}
	if (((rv = nng_socket_set_ms(s2, NNG_OPT_RECONNMINT, 10)) != 0) ||
	    ((rv = nng_socket_set_ms(s2, NNG_OPT_RECONNMAXT, 10)) != 0)) {
		goto done;
	}
	if ((strcmp(url, "socket://") != 0) &&
	    ((rv = nng_dial(s2, url, NULL, 0)) != 0)) {
		goto done;
	}

	nng_mtx_lock(note.mx);
	while ((note.cnt1 == 0) || (note.cnt2 == 0)) {
		if ((rv = nng_cv_until(note.cv, timeout)) != 0) {
			break;
		}
	}
	nng_mtx_unlock(note.mx);
	if (p1 != NULL) {
		*p1 = note.p1;
	}
	if (p2 != NULL) {
		*p2 = note.p2;
	}

done:
	nng_pipe_notify(s1, NNG_PIPE_EV_ADD_POST, NULL, NULL);
	nng_pipe_notify(s2, NNG_PIPE_EV_ADD_POST, NULL, NULL);
	if (note.cv != NULL) {
		nng_cv_free(note.cv);
	}
	if (note.mx != NULL) {
		nng_mtx_free(note.mx);
	}
	return (rv);
}